

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O1

void __thiscall Assimp::LWS::NodeDesc::~NodeDesc(NodeDesc *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->children).
           super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->children) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            (&(this->channels).
              super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>);
  pcVar2 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == &(this->path).field_2) {
    return;
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

NodeDesc()
        :   type()
        ,   id()
        ,   number  (0)
        ,   parent  (0)
        ,   name    ("")
        ,   isPivotSet (false)
        ,   lightColor (1.f,1.f,1.f)
        ,   lightIntensity (1.f)
        ,   lightType (0)
        ,   lightFalloffType (0)
        ,   lightConeAngle (45.f)
        ,   lightEdgeAngle()
        ,   parent_resolved (NULL)
    {}